

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::iterate
          (ComputeShaderGeneratedCase *this)

{
  TextureFormat *pTVar1;
  pointer pVVar2;
  ostringstream *poVar3;
  bool bVar4;
  bool bVar5;
  RenderContext *context;
  BitDesc *pBVar6;
  TextureFormat TVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  RenderTarget *pRVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar15;
  uint *puVar16;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  char *pcVar20;
  int iVar21;
  Bitfield<16UL> *pBVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  size_t sVar27;
  uint *puVar28;
  char *pcVar29;
  uint *puVar30;
  long lVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  deUint32 vaoID;
  Surface surface;
  Vec4 green;
  Vec4 yellow;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> buffer;
  uint *local_248;
  undefined4 local_23c;
  uint *local_238;
  long local_230;
  long local_228;
  ulong local_220;
  Surface local_218;
  Bitfield<16UL> local_200;
  undefined1 local_1e8 [8];
  undefined8 uStack_1e0;
  BitDesc *local_1d8;
  size_t local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar14;
  
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar9 = pRVar13->m_width;
  if (0x3ff < iVar9) {
    iVar9 = 0x400;
  }
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar23 = 0x400;
  if (pRVar13->m_height < 0x400) {
    iVar23 = pRVar13->m_height;
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar31 = CONCAT44(extraout_var,iVar8);
  tcu::Surface::Surface(&local_218,iVar9,iVar23);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Preparing to draw ",0x12);
  std::ostream::operator<<(poVar3,this->m_gridSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," x ",3);
  std::ostream::operator<<(poVar3,this->m_gridSize);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," grid.",6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  if (this->m_computeCmd == false) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Uploading draw command buffer.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar14 = CONCAT44(extraout_var_00,iVar9);
    iVar8 = this->m_gridSize * this->m_gridSize * 2;
    iVar9 = this->m_numDrawCmds;
    iVar23 = iVar8 / iVar9;
    uVar15 = (long)iVar8 % (long)iVar9 & 0xffffffff;
    if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
      puVar16 = (uint *)0x0;
      if (iVar9 < 1) {
        puVar30 = (uint *)0x0;
        local_248 = (uint *)0x0;
        puVar28 = puVar16;
        local_228 = lVar14;
      }
      else {
        uVar24 = iVar23 * 3;
        iVar9 = 0;
        local_248 = (uint *)0x0;
        puVar28 = (uint *)0x0;
        puVar30 = (uint *)0x0;
        local_230 = lVar31;
        local_228 = lVar14;
        do {
          uVar18 = (uint)puVar16;
          if (puVar28 == puVar30) {
            sVar27 = (long)puVar28 - (long)local_248;
            local_238 = puVar30;
            if (sVar27 == 0x7ffffffffffffff0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar32 = (long)sVar27 >> 4;
            uVar15 = 1;
            if (puVar28 != local_248) {
              uVar15 = uVar32;
            }
            uVar17 = uVar15 + uVar32;
            if (0x7fffffffffffffe < uVar17) {
              uVar17 = 0x7ffffffffffffff;
            }
            local_220 = 0x7ffffffffffffff;
            if (!CARRY8(uVar15,uVar32)) {
              local_220 = uVar17;
            }
            if (local_220 == 0) {
              puVar16 = (uint *)0x0;
            }
            else {
              puVar16 = (uint *)operator_new(local_220 << 4);
            }
            puVar16[uVar32 * 4] = uVar24;
            puVar16[uVar32 * 4 + 1] = 1;
            puVar16[uVar32 * 4 + 2] = uVar18;
            puVar16[uVar32 * 4 + 3] = 0;
            if (0 < (long)sVar27) {
              memmove(puVar16,local_248,sVar27);
            }
            if (local_248 != (uint *)0x0) {
              operator_delete(local_248,(long)local_238 - (long)local_248);
            }
            puVar28 = (uint *)(sVar27 + (long)puVar16);
            puVar30 = puVar16 + local_220 * 4;
            local_248 = puVar16;
          }
          else {
            *puVar28 = uVar24;
            puVar28[1] = 1;
            puVar28[2] = uVar18;
            puVar28[3] = 0;
          }
          puVar28 = puVar28 + 4;
          iVar9 = iVar9 + 1;
          puVar16 = (uint *)(ulong)(uVar18 + uVar24);
          lVar31 = local_230;
        } while (iVar9 < this->m_numDrawCmds);
      }
      lVar14 = local_228;
      (**(code **)(local_228 + 0x40))(0x8f3f,this->m_cmdBufferID);
      (**(code **)(lVar14 + 0x150))(0x8f3f,(long)puVar28 - (long)local_248,local_248,0x88e4);
LAB_0038dbef:
      if (local_248 != (uint *)0x0) {
        operator_delete(local_248,(long)puVar30 - (long)local_248);
      }
    }
    else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      puVar16 = (uint *)0x0;
      if (iVar9 < 1) {
        puVar30 = (uint *)0x0;
        local_248 = (uint *)0x0;
        puVar28 = puVar16;
        local_228 = lVar14;
      }
      else {
        uVar24 = iVar23 * 3;
        local_1b8 = 0x7ffffffffffffff8;
        iVar9 = 0;
        local_248 = (uint *)0x0;
        puVar28 = (uint *)0x0;
        puVar30 = (uint *)0x0;
        local_230 = lVar31;
        local_228 = lVar14;
        do {
          uVar18 = (uint)puVar16;
          if (puVar28 == puVar30) {
            sVar27 = (long)puVar28 - (long)local_248;
            local_238 = puVar30;
            if (sVar27 == local_1b8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar31 = (long)sVar27 >> 2;
            uVar32 = lVar31 * -0x3333333333333333;
            uVar15 = uVar32;
            if (puVar28 == local_248) {
              uVar15 = 1;
            }
            uVar17 = uVar15 + uVar32;
            if (0x666666666666665 < uVar17) {
              uVar17 = 0x666666666666666;
            }
            local_220 = 0x666666666666666;
            if (!CARRY8(uVar15,uVar32)) {
              local_220 = uVar17;
            }
            if (local_220 == 0) {
              puVar16 = (uint *)0x0;
            }
            else {
              puVar16 = (uint *)operator_new(local_220 * 0x14);
            }
            puVar16[lVar31] = uVar24;
            puVar16[lVar31 + 1] = 1;
            puVar16[lVar31 + 2] = uVar18;
            (puVar16 + lVar31 + 3)[0] = 0;
            (puVar16 + lVar31 + 3)[1] = 0;
            if (0 < (long)sVar27) {
              memmove(puVar16,local_248,sVar27);
            }
            if (local_248 != (uint *)0x0) {
              operator_delete(local_248,(long)local_238 - (long)local_248);
            }
            puVar28 = (uint *)(sVar27 + (long)puVar16);
            puVar30 = puVar16 + local_220 * 5;
            local_248 = puVar16;
          }
          else {
            *puVar28 = uVar24;
            puVar28[1] = 1;
            puVar28[2] = uVar18;
            puVar28[3] = 0;
            puVar28[4] = 0;
          }
          uVar15 = (ulong)uVar24;
          puVar28 = puVar28 + 5;
          iVar9 = iVar9 + 1;
          puVar16 = (uint *)(ulong)(uVar18 + uVar24);
          lVar31 = local_230;
        } while (iVar9 < this->m_numDrawCmds);
      }
      lVar14 = local_228;
      (**(code **)(local_228 + 0x40))(0x8f3f,this->m_cmdBufferID,uVar15);
      (**(code **)(lVar14 + 0x150))(0x8f3f,(long)puVar28 - (long)local_248,local_248,0x88e4);
      goto LAB_0038dbef;
    }
    dVar10 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar10,"create draw command",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x572);
  }
  if (this->m_computeData != false) goto LAB_0038e252;
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Uploading draw data buffer.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  local_1e8._0_4_ = 0x3f800000;
  local_1e8._4_4_ = 0x3f800000;
  uStack_1e0 = (BitDesc *)0x3f80000000000000;
  local_200.m_value._0_4_ = R;
  local_200.m_value._4_4_ = 0x3f800000;
  local_200.m_begin._0_4_ = R;
  local_200.m_begin._4_4_ = 0x3f800000;
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var_01,iVar9);
  if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    iVar9 = this->m_gridSize + 1;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b0,
               (long)(iVar9 * iVar9 * 4),(allocator_type *)&local_23c);
    if ((uint)this->m_gridSize < 0x7fffffff) {
      iVar9 = 0;
      iVar23 = 0;
      do {
        uVar24 = this->m_gridSize;
        if (uVar24 < 0x7fffffff) {
          iVar19 = uVar24 + 1;
          iVar8 = 0;
          iVar26 = 3;
          do {
            fVar34 = (float)iVar8 / (float)(int)uVar24;
            fVar34 = fVar34 + fVar34 + -1.0;
            fVar35 = (float)iVar23 / (float)(int)uVar24;
            fVar35 = fVar35 + fVar35 + -1.0;
            iVar19 = (iVar19 * iVar23 + iVar8) * 4;
            ((pointer)(local_1b0._0_8_ + (long)iVar19 * 0x10))->m_data[0] = fVar34;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar19 * 0x10))->m_data + 4) =
                 fVar35;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar19 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            TVar7.type = local_200.m_begin._4_4_;
            TVar7.order = (ChannelOrder)local_200.m_begin;
            pTVar1 = (TextureFormat *)
                     (local_1b0._0_8_ + (long)((this->m_gridSize + 1) * iVar9 + iVar26 + -2) * 0x10)
            ;
            pTVar1->order = (undefined4)local_200.m_value;
            pTVar1->type = local_200.m_value._4_4_;
            pTVar1[1] = TVar7;
            iVar19 = (this->m_gridSize + 1) * iVar9 + iVar26 + -1;
            ((pointer)(local_1b0._0_8_ + (long)iVar19 * 0x10))->m_data[0] = fVar34;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar19 * 0x10))->m_data + 4) =
                 fVar35;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar19 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            pVVar2 = (pointer)(local_1b0._0_8_ +
                              (long)((this->m_gridSize + 1) * iVar9 + iVar26) * 0x10);
            pVVar2->m_data[0] = (float)local_1e8._0_4_;
            *(undefined4 *)((long)pVVar2->m_data + 4) = local_1e8._4_4_;
            *(int *)((long)pVVar2->m_data + 8) = (int)uStack_1e0;
            *(int *)((long)pVVar2->m_data + 0xc) = uStack_1e0._4_4_;
            iVar8 = iVar8 + 1;
            uVar24 = this->m_gridSize;
            iVar19 = uVar24 + 1;
            iVar26 = iVar26 + 4;
          } while (iVar8 < iVar19);
        }
        iVar23 = iVar23 + 1;
        iVar9 = iVar9 + 4;
      } while (iVar23 < this->m_gridSize + 1);
    }
    (**(code **)(lVar14 + 0x40))(0x8892,this->m_dataBufferID);
    (**(code **)(lVar14 + 0x150))
              (0x8892,(long)(local_1b0._8_4_ - (int)local_1b0._0_8_) & 0xfffffffffffffff0,
               local_1b0._0_8_,0x88e4);
LAB_0038e214:
    if ((pointer)local_1b0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ - local_1b0._0_8_);
    }
  }
  else if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_1b0,
               (long)(this->m_gridSize * this->m_gridSize * 0xc),(allocator_type *)&local_23c);
    if (0 < this->m_gridSize) {
      iVar9 = 0;
      do {
        iVar23 = this->m_gridSize;
        if (0 < iVar23) {
          iVar8 = 0;
          do {
            fVar36 = (float)iVar23;
            fVar34 = (float)iVar8 / fVar36 + (float)iVar8 / fVar36 + -1.0;
            fVar35 = (float)iVar9 / fVar36 + (float)iVar9 / fVar36 + -1.0;
            pBVar22 = (Bitfield<16UL> *)local_1e8;
            if ((iVar9 + iVar8 & 1U) == 0) {
              pBVar22 = &local_200;
            }
            iVar23 = (iVar23 * iVar9 + iVar8) * 0xc;
            ((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data[0] = fVar34;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 4) =
                 fVar35;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            fVar37 = 2.0 / fVar36 + fVar34;
            iVar23 = (this->m_gridSize * iVar9 + iVar8) * 0xc + 2;
            ((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data[0] = fVar37;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 4) =
                 fVar35;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            fVar36 = 2.0 / fVar36 + fVar35;
            iVar23 = (this->m_gridSize * iVar9 + iVar8) * 0xc + 4;
            ((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data[0] = fVar37;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 4) =
                 fVar36;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            iVar23 = (this->m_gridSize * iVar9 + iVar8) * 0xc + 6;
            ((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data[0] = fVar34;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 4) =
                 fVar35;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            iVar23 = (this->m_gridSize * iVar9 + iVar8) * 0xc + 8;
            ((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data[0] = fVar37;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 4) =
                 fVar36;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            iVar23 = (this->m_gridSize * iVar9 + iVar8) * 0xc + 10;
            ((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data[0] = fVar34;
            *(float *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 4) =
                 fVar36;
            *(undefined8 *)((long)((pointer)(local_1b0._0_8_ + (long)iVar23 * 0x10))->m_data + 8) =
                 0x3f80000000000000;
            iVar23 = this->m_gridSize;
            pBVar6 = pBVar22->m_begin;
            *(qpTestLog **)
             ((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 1) * 0x10))->
             m_data = (qpTestLog *)pBVar22->m_value;
            *(BitDesc **)
             ((long)((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 1) * 0x10))
                    ->m_data + 8) = pBVar6;
            iVar23 = this->m_gridSize;
            pBVar6 = pBVar22->m_begin;
            *(qpTestLog **)
             ((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 3) * 0x10))->
             m_data = (qpTestLog *)pBVar22->m_value;
            *(BitDesc **)
             ((long)((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 3) * 0x10))
                    ->m_data + 8) = pBVar6;
            iVar23 = this->m_gridSize;
            pBVar6 = pBVar22->m_begin;
            *(qpTestLog **)
             ((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 5) * 0x10))->
             m_data = (qpTestLog *)pBVar22->m_value;
            *(BitDesc **)
             ((long)((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 5) * 0x10))
                    ->m_data + 8) = pBVar6;
            iVar23 = this->m_gridSize;
            pBVar6 = pBVar22->m_begin;
            *(qpTestLog **)
             ((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 7) * 0x10))->
             m_data = (qpTestLog *)pBVar22->m_value;
            *(BitDesc **)
             ((long)((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 7) * 0x10))
                    ->m_data + 8) = pBVar6;
            iVar23 = this->m_gridSize;
            pBVar6 = pBVar22->m_begin;
            *(qpTestLog **)
             ((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 9) * 0x10))->
             m_data = (qpTestLog *)pBVar22->m_value;
            *(BitDesc **)
             ((long)((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 9) * 0x10))
                    ->m_data + 8) = pBVar6;
            iVar23 = this->m_gridSize;
            pBVar6 = pBVar22->m_begin;
            *(qpTestLog **)
             ((pointer)(local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 0xb) * 0x10))->
             m_data = (qpTestLog *)pBVar22->m_value;
            *(BitDesc **)
             ((long)((pointer)
                    (local_1b0._0_8_ + (long)((iVar23 * iVar9 + iVar8) * 0xc + 0xb) * 0x10))->m_data
             + 8) = pBVar6;
            iVar8 = iVar8 + 1;
            iVar23 = this->m_gridSize;
          } while (iVar8 < iVar23);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < this->m_gridSize);
    }
    (**(code **)(lVar14 + 0x40))(0x8892,this->m_dataBufferID);
    (**(code **)(lVar14 + 0x150))
              (0x8892,(long)(local_1b0._8_4_ - (int)local_1b0._0_8_) & 0xfffffffffffffff0,
               local_1b0._0_8_,0x88e4);
    goto LAB_0038e214;
  }
  dVar10 = (**(code **)(lVar14 + 0x800))();
  glu::checkError(dVar10,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x5b6);
LAB_0038e252:
  if ((this->m_computeIndices == false) && (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS)) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Uploading draw index buffer.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar14 = CONCAT44(extraout_var_02,iVar9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e8,
               (long)(this->m_gridSize * this->m_gridSize * 6),(allocator_type *)&local_200);
    if (0 < this->m_gridSize) {
      iVar9 = 0;
      iVar23 = 2;
      iVar8 = 0;
      do {
        iVar26 = this->m_gridSize;
        if (0 < iVar26) {
          iVar21 = 0;
          iVar19 = 0;
          do {
            iVar25 = (iVar8 + iVar19) % 2;
            *(int *)((long)local_1e8 + (long)((iVar26 * iVar8 + iVar19) * 6) * 4) =
                 (iVar26 + 1) * iVar9 + iVar21 + iVar25;
            *(int *)((long)local_1e8 + (long)((this->m_gridSize * iVar8 + iVar19) * 6 + 1) * 4) =
                 (this->m_gridSize + 1) * iVar23 + iVar21 + iVar25;
            *(uint *)((long)local_1e8 + (long)((this->m_gridSize * iVar8 + iVar19) * 6 + 2) * 4) =
                 iVar21 + (this->m_gridSize + 1) * iVar23 + iVar25 + 2;
            *(int *)((long)local_1e8 + (long)((this->m_gridSize * iVar8 + iVar19) * 6 + 3) * 4) =
                 (this->m_gridSize + 1) * iVar9 + iVar21 + iVar25;
            *(uint *)((long)local_1e8 + (long)((this->m_gridSize * iVar8 + iVar19) * 6 + 4) * 4) =
                 (this->m_gridSize + 1) * iVar23 + iVar25 + iVar21 + 2;
            iVar26 = this->m_gridSize * iVar8 + iVar19;
            iVar19 = iVar19 + 1;
            *(uint *)((long)local_1e8 + (long)(iVar26 * 6 + 5) * 4) =
                 iVar21 + (this->m_gridSize + 1) * iVar9 + iVar25 + 2;
            iVar26 = this->m_gridSize;
            iVar21 = iVar21 + 2;
          } while (iVar19 < iVar26);
        }
        iVar8 = iVar8 + 1;
        iVar9 = iVar9 + 2;
        iVar23 = iVar23 + 2;
      } while (iVar8 < this->m_gridSize);
    }
    (**(code **)(lVar14 + 0x40))(0x8893,this->m_indexBufferID);
    (**(code **)(lVar14 + 0x150))
              (0x8893,(long)(int)((int)uStack_1e0 - local_1e8._0_4_) & 0xfffffffffffffffc,local_1e8,
               0x88e4);
    dVar10 = (**(code **)(lVar14 + 0x800))();
    glu::checkError(dVar10,SSBOArrayLengthTests::init::arraysSized + 1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x5d1);
    if ((TextureFormat)local_1e8 != (TextureFormat)0x0) {
      operator_delete((void *)local_1e8,(long)local_1d8 - (long)local_1e8);
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Filling following buffers using compute shader:\n",0x30);
  pcVar20 = "\tcommand buffer\n";
  pcVar29 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (this->m_computeCmd == false) {
    pcVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,pcVar20,(ulong)this->m_computeCmd << 4);
  pcVar20 = "\tdata buffer\n";
  bVar33 = this->m_computeData == false;
  if (bVar33) {
    pcVar20 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  lVar14 = 0xd;
  if (bVar33) {
    lVar14 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar20,lVar14);
  bVar33 = this->m_computeIndices != false;
  if (bVar33) {
    pcVar29 = "\tindex buffer\n";
  }
  lVar14 = 0xe;
  if (!bVar33) {
    lVar14 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar29,lVar14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  bVar33 = this->m_computeCmd;
  bVar4 = this->m_computeData;
  bVar5 = this->m_computeIndices;
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Memory barrier. Barriers = ",0x1b);
  iVar9 = ((uint)bVar33 << 6 | (uint)bVar4) + (uint)bVar5 * 2;
  glu::getMemoryBarrierFlagsStr(&local_200,iVar9);
  local_1d8 = local_200.m_end;
  uStack_1e0 = (BitDesc *)CONCAT44(local_200.m_begin._4_4_,(ChannelOrder)local_200.m_begin);
  local_1e8 = (undefined1  [8])local_200.m_value;
  tcu::Format::Bitfield<16UL>::toStream((Bitfield<16UL> *)local_1e8,(ostream *)poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar31 + 0xdb8))(iVar9);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar3,"Drawing from buffers with ",0x1a);
  std::ostream::operator<<(poVar3,this->m_numDrawCmds);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," draw call(s).",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_138);
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar31 = CONCAT44(extraout_var_03,iVar9);
  uVar11 = (**(code **)(lVar31 + 0x780))((this->m_shaderProgram->m_program).m_program,"a_position");
  uVar12 = (**(code **)(lVar31 + 0x780))((this->m_shaderProgram->m_program).m_program,"a_color");
  local_23c = 0;
  (**(code **)(lVar31 + 0x708))(1);
  (**(code **)(lVar31 + 0xd8))(local_23c);
  (**(code **)(lVar31 + 0x40))(0x8892,this->m_dataBufferID);
  (**(code **)(lVar31 + 0x19f0))(uVar11,4,0x1406,0,0x20,0);
  (**(code **)(lVar31 + 0x19f0))(uVar12,4,0x1406,0,0x20,0x10);
  (**(code **)(lVar31 + 0x610))(uVar11);
  (**(code **)(lVar31 + 0x610))(uVar12);
  if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
    (**(code **)(lVar31 + 0x40))(0x8893,this->m_indexBufferID);
  }
  (**(code **)(lVar31 + 0x40))(0x8f3f,this->m_cmdBufferID);
  (**(code **)(lVar31 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar31 + 0x188))(0x4000);
  (**(code **)(lVar31 + 0x1a00))(0,0,local_218.m_width,local_218.m_height);
  (**(code **)(lVar31 + 0x1680))((this->m_shaderProgram->m_program).m_program);
  if (0 < this->m_numDrawCmds) {
    iVar9 = 0;
    do {
      if (this->m_drawMethod == DRAWMETHOD_DRAWARRAYS) {
        (**(code **)(lVar31 + 0x540))(4,this->m_commandSize * iVar9);
      }
      else if (this->m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
        (**(code **)(lVar31 + 0x578))(4,0x1405);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->m_numDrawCmds);
  }
  (**(code **)(lVar31 + 0x1680))(0);
  (**(code **)(lVar31 + 0x490))(1,&local_23c);
  dVar10 = (**(code **)(lVar31 + 0x800))();
  glu::checkError(dVar10,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x605);
  (**(code **)(lVar31 + 0x648))();
  dVar10 = (**(code **)(lVar31 + 0x800))();
  glu::checkError(dVar10,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x608);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_200.m_value = 0x300000008;
  if ((void *)local_218.m_pixels.m_cap != (void *)0x0) {
    local_218.m_pixels.m_cap = (size_t)local_218.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1e8,(TextureFormat *)&local_200,local_218.m_width,
             local_218.m_height,1,(void *)local_218.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1e8);
  dVar10 = (**(code **)(lVar31 + 0x800))();
  glu::checkError(dVar10,SSBOArrayLengthTests::init::arraysSized + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x60b);
  bVar33 = verifyImageYellowGreen
                     (&local_218,
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pcVar20 = "Result image invalid";
  if (bVar33) {
    pcVar20 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar33,pcVar20);
  tcu::Surface::~Surface(&local_218);
  return STOP;
}

Assistant:

ComputeShaderGeneratedCase::IterateResult ComputeShaderGeneratedCase::iterate (void)
{
	const int				renderTargetWidth	= de::min(1024, m_context.getRenderTarget().getWidth());
	const int				renderTargetHeight	= de::min(1024, m_context.getRenderTarget().getHeight());
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			surface				(renderTargetWidth, renderTargetHeight);

	m_testCtx.getLog() << tcu::TestLog::Message << "Preparing to draw " << m_gridSize << " x " << m_gridSize << " grid." << tcu::TestLog::EndMessage;

	try
	{
		// Gen command buffer
		if (!m_computeCmd)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw command buffer." << tcu::TestLog::EndMessage;
			createDrawCommand();
		}

		// Gen data buffer
		if (!m_computeData)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw data buffer." << tcu::TestLog::EndMessage;
			createDrawData();
		}

		// Gen index buffer
		if (!m_computeIndices && m_drawMethod == DRAWMETHOD_DRAWELEMENTS)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Uploading draw index buffer." << tcu::TestLog::EndMessage;
			createDrawIndices();
		}

		// Run compute shader
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Filling following buffers using compute shader:\n"
				<< ((m_computeCmd)		? ("\tcommand buffer\n")	: (""))
				<< ((m_computeData)		? ("\tdata buffer\n")		: (""))
				<< ((m_computeIndices)	? ("\tindex buffer\n")		: (""))
				<< tcu::TestLog::EndMessage;
			runComputeShader();
		}

		// Ensure data is written to the buffers before we try to read it
		{
			const glw::GLuint barriers = ((m_computeCmd)     ? (GL_COMMAND_BARRIER_BIT)             : (0)) |
										 ((m_computeData)    ? (GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT) : (0)) |
										 ((m_computeIndices) ? (GL_ELEMENT_ARRAY_BARRIER_BIT)       : (0));

			m_testCtx.getLog() << tcu::TestLog::Message << "Memory barrier. Barriers = " << glu::getMemoryBarrierFlagsStr(barriers) << tcu::TestLog::EndMessage;
			gl.memoryBarrier(barriers);
		}

		// Draw from buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing from buffers with " << m_numDrawCmds << " draw call(s)." << tcu::TestLog::EndMessage;
		renderTo(surface);
	}
	catch (glu::OutOfMemoryError&)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Got GL_OUT_OF_MEMORY." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Got GL_OUT_OF_MEMORY");
		m_testCtx.setTerminateAfter(true); // Do not rely on implementation to be able to recover from OOM
		return STOP;
	}


	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all grid cells were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}